

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O0

Dims * adios2::helper::StringToDims(string *dimensions)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  char *pcVar2;
  long lVar3;
  string *in_RSI;
  Dims *in_RDI;
  string s;
  string s_1;
  size_t end;
  size_t begin;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *shape;
  size_t *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  string local_80 [32];
  unsigned_long_long local_60;
  string local_48 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9c57f1);
  local_20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_28 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    pvVar4 = local_28;
    pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)std::__cxx11::string::size();
    if (pvVar1 <= pvVar4) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
    if (*pcVar2 == ',') {
      std::__cxx11::string::string
                (local_48,local_10,(ulong)local_20,(long)local_28 - (long)local_20);
      local_60 = std::__cxx11::stoull(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      local_28 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(local_28->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
      local_20 = local_28;
      std::__cxx11::string::~string(local_48);
    }
    local_28 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  pvVar4 = local_20;
  lVar3 = std::__cxx11::string::size();
  std::__cxx11::string::string(local_80,local_10,(ulong)pvVar4,lVar3 - (long)local_20);
  pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::__cxx11::stoull(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (pvVar1,in_stack_ffffffffffffff38);
  local_11 = 1;
  std::__cxx11::string::~string(local_80);
  if ((local_11 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar4);
  }
  return in_RDI;
}

Assistant:

Dims StringToDims(const std::string &dimensions)
{
    std::vector<size_t> shape;
    size_t begin = 0;
    for (size_t end = 0; end < dimensions.size(); ++end)
    {
        if (dimensions[end] == ',')
        {
            std::string s(dimensions, begin, end - begin);
            shape.push_back(stoull(s));
            begin = end + 1;
            end = begin;
        }
    }
    std::string s(dimensions, begin, dimensions.size() - begin);
    shape.push_back(stoull(s));
    return shape;
}